

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O1

pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
helics::TimeDependencies::checkForIssues_abi_cxx11_
          (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,TimeDependencies *this,bool waiting)

{
  pointer pDVar1;
  bool bVar2;
  byte bVar3;
  DependencyInfo *dep;
  pointer pDVar4;
  
  pDVar4 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar4 != pDVar1) {
    do {
      bVar2 = true;
      bVar3 = waiting;
      if ((((pDVar4->dependency == true) && (pDVar4->dependent == true)) &&
          ((pDVar4->super_TimeData).delayedTiming == true)) && (pDVar4->connection != SELF)) {
        (this->mDelayedDependency).gid = (pDVar4->fedID).gid;
        bVar2 = true;
        bVar3 = 1;
        if ((waiting & 1U) != 0) {
          __return_storage_ptr__->first = 0xf;
          (__return_storage_ptr__->second)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->second).field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&__return_storage_ptr__->second,
                     "Multiple federates declaring wait_for_current_time flag will result in deadlock"
                     ,"");
          bVar2 = false;
          bVar3 = waiting;
        }
      }
      waiting = (bool)bVar3;
      if (!bVar2) {
        return __return_storage_ptr__;
      }
      pDVar4 = pDVar4 + 1;
    } while (pDVar4 != pDVar1);
  }
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__return_storage_ptr__->second,"");
  return __return_storage_ptr__;
}

Assistant:

std::pair<int, std::string> TimeDependencies::checkForIssues(bool waiting) const
{
    // check for timing deadlock with wait_for_current_time_flag

    bool hasDelayedTiming = waiting;
    for (const auto& dep : dependencies) {
        if (dep.dependency && dep.dependent && dep.delayedTiming &&
            dep.connection != ConnectionType::SELF) {
            mDelayedDependency = dep.fedID;
            if (hasDelayedTiming) {
                return {
                    multiple_wait_for_current_time_flags,
                    "Multiple federates declaring wait_for_current_time flag will result in deadlock"};
            }
            hasDelayedTiming = true;
        }
    }
    return {0, ""};
}